

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::increaseIntensity_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int beam,double intensity,int ratio)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  pair<int,_int> pVar4;
  int iVar5;
  ulong uVar6;
  double local_48;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  pVar4 = getPos(this,beam);
  uVar2 = pVar4.first - ratio;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  iVar5 = ratio + pVar4.first + 1;
  local_48 = intensity;
  while( true ) {
    iVar3 = Collimator::getXdim(this->collimator);
    if (iVar5 <= iVar3) {
      iVar3 = iVar5;
    }
    if ((long)iVar3 <= (long)uVar6) break;
    dVar1 = (this->I).p[uVar6][(long)pVar4 >> 0x20];
    if ((dVar1 != -1.0) || (NAN(dVar1))) {
      if (this->max_intensity < (int)local_48 + (int)dVar1) {
        local_48 = (double)this->max_intensity - dVar1;
      }
      local_48 = (double)(-(ulong)(dVar1 < -local_48) & (ulong)-dVar1 |
                         ~-(ulong)(dVar1 < -local_48) & (ulong)local_48);
      change_intensity(this,(int)uVar6,pVar4.second,dVar1 + local_48,__return_storage_ptr__);
    }
    uVar6 = uVar6 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

list< pair< int, double > > Station::increaseIntensity(int beam, double intensity, int ratio){
	list< pair< int, double > > diff;
    pair<int,int> p = getPos(beam);
    int x=p.first, j=p.second;
    for(int i=max(x-ratio,0); i<min(x+ratio+1,collimator.getXdim()); i++){
      //for(int j=max(y-ratio,0); j<min(y+ratio+1,collimator.getYdim()); j++){
    	  if(I(i,j)==-1) continue;
        if((int) I(i,j)+ (int) intensity > (int) max_intensity) intensity=max_intensity-I(i,j);
        if(I(i,j)<-intensity) intensity=-I(i,j);
        change_intensity(i, j, I(i,j)+intensity, &diff);
      //}
    }
    return diff;
  }